

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void move_pending_to_connect(Curl_multi *multi,Curl_easy *data)

{
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  Curl_node_remove(&data->multi_queue);
  Curl_llist_append(&multi->process,data,&data->multi_queue);
  mstate(data,MSTATE_CONNECT);
  Curl_expire(data,0,EXPIRE_RUN_NOW);
  return;
}

Assistant:

static void move_pending_to_connect(struct Curl_multi *multi,
                                    struct Curl_easy *data)
{
  DEBUGASSERT(data->mstate == MSTATE_PENDING);

  /* Remove this node from the pending list */
  Curl_node_remove(&data->multi_queue);

  /* put it into the process list */
  Curl_llist_append(&multi->process, data, &data->multi_queue);

  multistate(data, MSTATE_CONNECT);

  /* Make sure that the handle will be processed soonish. */
  Curl_expire(data, 0, EXPIRE_RUN_NOW);
}